

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

bool __thiscall gimage::ImageIO::handlesFile(ImageIO *this,char *name,bool reading)

{
  exception *anon_var_0;
  bool ret;
  bool in_stack_00000077;
  char *in_stack_00000078;
  ImageIO *in_stack_00000080;
  
  getBasicImageIO(in_stack_00000080,in_stack_00000078,in_stack_00000077);
  return true;
}

Assistant:

bool ImageIO::handlesFile(const char *name, bool reading) const
{
  bool ret;

  try
  {
    getBasicImageIO(name, reading);
    ret=true;
  }
  catch (const std::exception &)
  {
    ret=false;
  }

  return ret;
}